

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_map_based.cpp
# Opt level: O0

void __thiscall
so_5::impl::map_based_subscr_storage::storage_t::storage_t(storage_t *this,agent_t *owner)

{
  agent_t *owner_local;
  storage_t *this_local;
  
  subscription_storage_t::subscription_storage_t(&this->super_subscription_storage_t,owner);
  (this->super_subscription_storage_t)._vptr_subscription_storage_t =
       (_func_int **)&PTR__storage_t_005c18a0;
  std::
  map<so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
  ::map(&this->m_events);
  return;
}

Assistant:

storage_t::storage_t( agent_t * owner )
	:	subscription_storage_t( owner )
	{}